

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_outbound.hpp
# Opt level: O3

string * std::operator<<(string *str,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *obj)

{
  string *psVar1;
  stringstream ss;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  operator<<(local_188,obj);
  std::__cxx11::stringbuf::str();
  psVar1 = (string *)std::__cxx11::string::operator=((string *)str,(string *)local_1b8);
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return psVar1;
}

Assistant:

string& operator << (string& str, const T& obj)
        {
            stringstream ss;
            ss << obj; // call ostream& operator << (ostream& os,
            return str = ss.str();
        }